

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  uint64_t *key;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  size_t len;
  long lVar4;
  uchar *data;
  secp256k1_fe *data_00;
  ulong uVar5;
  long lVar6;
  long unaff_R13;
  long lVar7;
  bool bVar8;
  secp256k1_hmac_sha256 sStack_148;
  secp256k1_fe *psStack_78;
  undefined8 uStack_70;
  long lStack_68;
  secp256k1_fe *psStack_60;
  secp256k1_fe *psStack_58;
  long lStack_50;
  long lStack_48;
  code *pcStack_40;
  
  lVar7 = 0;
  lVar6 = 0;
  uVar5 = 0;
  do {
    if (lVar7 < alen) {
      uVar2 = factor * a->v[lVar7];
      uVar3 = SUB168(SEXT816(factor) * SEXT816(a->v[lVar7]),8);
      if ((long)uVar3 < 0) {
        lVar4 = (-0x8000000000000000 - uVar3) - (ulong)(uVar2 != 0);
        lVar1 = lVar6 - lVar4;
        unaff_R13 = lVar1 - (ulong)(uVar5 < -uVar2);
        if ((SBORROW8(lVar6,lVar4) != SBORROW8(lVar1,(ulong)(uVar5 < -uVar2))) == unaff_R13 < 0)
        goto LAB_0014a87d;
      }
      else {
        lVar1 = (uVar3 ^ 0x7fffffffffffffff) - lVar6;
        unaff_R13 = lVar1 - (ulong)(~uVar2 < uVar5);
        if ((SBORROW8(uVar3 ^ 0x7fffffffffffffff,lVar6) != SBORROW8(lVar1,(ulong)(~uVar2 < uVar5)))
            == unaff_R13 < 0) {
LAB_0014a87d:
          bVar8 = CARRY8(uVar5,uVar2);
          uVar5 = uVar5 + uVar2;
          lVar6 = lVar6 + uVar3 + (ulong)bVar8;
          goto LAB_0014a883;
        }
      }
      pcStack_40 = (code *)0x14a8e9;
      secp256k1_modinv64_mul_62_cold_3();
      goto LAB_0014a8e9;
    }
LAB_0014a883:
    uVar2 = lVar6 << 2 | uVar5 >> 0x3e;
    r->v[lVar7] = uVar5 & 0x3fffffffffffffff;
    lVar6 = lVar6 >> 0x3e;
    lVar7 = lVar7 + 1;
    uVar5 = uVar2;
  } while (lVar7 != 4);
  if (4 < alen) {
    uVar5 = factor * a->v[4];
    bVar8 = CARRY8(uVar2,uVar5);
    uVar2 = uVar2 + uVar5;
    lVar6 = lVar6 + SUB168(SEXT816(factor) * SEXT816(a->v[4]),8) + (ulong)bVar8;
  }
  if (lVar6 + -1 + (ulong)(0x7fffffffffffffff < uVar2) == -1) {
    if (lVar6 == (long)uVar2 >> 0x3f) {
      r->v[4] = uVar2;
      return;
    }
  }
  else {
LAB_0014a8e9:
    pcStack_40 = (code *)0x14a8ee;
    secp256k1_modinv64_mul_62_cold_2();
  }
  pcStack_40 = secp256k1_gej_verify;
  secp256k1_modinv64_mul_62_cold_1();
  pcStack_40 = (code *)0x7fffffffffffffff;
  psStack_58 = (secp256k1_fe *)0x14a900;
  lStack_50 = (long)alen;
  lStack_48 = lVar7;
  secp256k1_fe_verify((secp256k1_fe *)r);
  a_00 = (secp256k1_fe *)((long)r + 0x30);
  psStack_58 = (secp256k1_fe *)0x14a90c;
  secp256k1_fe_verify(a_00);
  a_01 = (secp256k1_fe *)((long)r + 0x60);
  psStack_58 = (secp256k1_fe *)0x14a918;
  secp256k1_fe_verify(a_01);
  psStack_58 = (secp256k1_fe *)0x14a925;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)r,4);
  psStack_58 = (secp256k1_fe *)0x14a932;
  secp256k1_fe_verify_magnitude(a_00,4);
  data = (uchar *)0x1;
  psStack_58 = (secp256k1_fe *)0x14a93f;
  data_00 = a_01;
  secp256k1_fe_verify_magnitude(a_01,1);
  if (1 < (uint)((secp256k1_fe *)((long)r + 0x90))->n[0]) {
    psStack_58 = (secp256k1_fe *)secp256k1_rfc6979_hmac_sha256_initialize;
    secp256k1_gej_verify_cold_1();
    uStack_70 = 0x3fffffffffffffff;
    data_00->n[2] = 0x101010101010101;
    data_00->n[3] = 0x101010101010101;
    data_00->n[0] = 0x101010101010101;
    data_00->n[1] = 0x101010101010101;
    key = data_00->n + 4;
    data_00->n[4] = 0;
    data_00->magnitude = 0;
    data_00->normalized = 0;
    data_00[1].n[0] = 0;
    data_00[1].n[1] = 0;
    psStack_78 = (secp256k1_fe *)r;
    lStack_68 = unaff_R13;
    psStack_60 = a_00;
    psStack_58 = a_01;
    secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
    secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
    secp256k1_sha256_write(&sStack_148.inner,"",1);
    secp256k1_sha256_write(&sStack_148.inner,data,len);
    secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)key);
    secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
    secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
    secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)data_00);
    secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
    secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
    secp256k1_sha256_write(&sStack_148.inner,"\x01",1);
    secp256k1_sha256_write(&sStack_148.inner,data,len);
    secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)key);
    secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
    secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
    secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)data_00);
    *(undefined4 *)(data_00[1].n + 2) = 0;
    return;
  }
  return;
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}